

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase66::run(TestCase66 *this)

{
  char **this_00;
  bool bVar1;
  char *begin;
  char *end;
  ParserRef<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> PVar2;
  bool local_7c;
  bool local_7b;
  undefined1 local_7a [6];
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  ParserRef<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> wrapped;
  char local_60;
  undefined1 local_5f [3];
  bool local_5c;
  Exactly_<char> parser;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  Maybe<kj::_::Tuple<>_> local_58;
  bool local_56;
  bool local_55;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  char local_44;
  undefined1 local_43 [9];
  Maybe<kj::_::Tuple<>_> result;
  Input input;
  StringPtr text;
  TestCase66 *this_local;
  
  this_00 = &input.best;
  StringPtr::StringPtr((StringPtr *)this_00,"foo");
  begin = StringPtr::begin((StringPtr *)this_00);
  end = StringPtr::end((StringPtr *)this_00);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)((long)local_43 + 3),begin,end);
  local_44 = 'f';
  local_43[0] = exactly<char>(&local_44);
  Exactly_<char>::operator()
            ((Exactly_<char> *)((long)local_43 + 1),(IteratorInput<char,_const_char_*> *)local_43);
  bVar1 = Maybe<kj::_::Tuple<>_>::operator!=
                    ((Maybe<kj::_::Tuple<>_> *)((long)local_43 + 1),(void *)0x0);
  if (!bVar1) {
    local_55 = kj::_::Debug::shouldLog(ERROR);
    while (local_55 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x47,ERROR,"\"failed: expected \" \"result != nullptr\"",
                 (char (*) [35])"failed: expected result != nullptr");
      local_55 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)((long)local_43 + 3));
  if (bVar1) {
    local_56 = kj::_::Debug::shouldLog(ERROR);
    while (local_56 != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x48,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      local_56 = false;
    }
  }
  _kj_shouldLog_5 = true;
  _kj_shouldLog_4 = (bool)exactly<char>(&_kj_shouldLog_5);
  Exactly_<char>::operator()
            ((Exactly_<char> *)&local_58,(IteratorInput<char,_const_char_*> *)&_kj_shouldLog_4);
  Maybe<kj::_::Tuple<>_>::operator=((Maybe<kj::_::Tuple<>_> *)((long)local_43 + 1),&local_58);
  Maybe<kj::_::Tuple<>_>::~Maybe(&local_58);
  bVar1 = Maybe<kj::_::Tuple<>_>::operator!=
                    ((Maybe<kj::_::Tuple<>_> *)((long)local_43 + 1),(void *)0x0);
  if (!bVar1) {
    parser.expected = kj::_::Debug::shouldLog(ERROR);
    while (parser.expected != '\0') {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x4b,ERROR,"\"failed: expected \" \"result != nullptr\"",
                 (char (*) [35])"failed: expected result != nullptr");
      parser.expected = '\0';
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)((long)local_43 + 3));
  if (bVar1) {
    local_5c = kj::_::Debug::shouldLog(ERROR);
    while (local_5c != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x4c,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      local_5c = false;
    }
  }
  local_60 = 'x';
  local_5f[0] = exactly<char>(&local_60);
  Exactly_<char>::operator()
            ((Exactly_<char> *)((long)local_5f + 1),(IteratorInput<char,_const_char_*> *)local_5f);
  Maybe<kj::_::Tuple<>_>::operator=
            ((Maybe<kj::_::Tuple<>_> *)((long)local_43 + 1),
             (Maybe<kj::_::Tuple<>_> *)((long)local_5f + 1));
  Maybe<kj::_::Tuple<>_>::~Maybe((Maybe<kj::_::Tuple<>_> *)((long)local_5f + 1));
  bVar1 = Maybe<kj::_::Tuple<>_>::operator==
                    ((Maybe<kj::_::Tuple<>_> *)((long)local_43 + 1),(void *)0x0);
  if (!bVar1) {
    wrapped.wrapper._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)wrapped.wrapper._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x4f,ERROR,"\"failed: expected \" \"result == nullptr\"",
                 (char (*) [35])"failed: expected result == nullptr");
      wrapped.wrapper._7_1_ = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)((long)local_43 + 3));
  if (bVar1) {
    wrapped.wrapper._6_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)wrapped.wrapper._6_1_ != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x50,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      wrapped.wrapper._6_1_ = false;
    }
  }
  wrapped.wrapper._4_1_ = 0x6f;
  wrapped.wrapper._5_1_ = exactly<char>((char *)((long)&wrapped.wrapper + 4));
  PVar2 = ref<kj::parse::IteratorInput<char,char_const*>,kj::parse::Exactly_<char>>
                    ((Exactly_<char> *)((long)&wrapped.wrapper + 5));
  wrapped.parser = PVar2.wrapper;
  register0x00000000 = PVar2.parser;
  ParserRef<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>::operator()
            ((ParserRef<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> *)local_7a,
             (IteratorInput<char,_const_char_*> *)(local_7a + 2));
  Maybe<kj::_::Tuple<>_>::operator=
            ((Maybe<kj::_::Tuple<>_> *)((long)local_43 + 1),(Maybe<kj::_::Tuple<>_> *)local_7a);
  Maybe<kj::_::Tuple<>_>::~Maybe((Maybe<kj::_::Tuple<>_> *)local_7a);
  bVar1 = Maybe<kj::_::Tuple<>_>::operator!=
                    ((Maybe<kj::_::Tuple<>_> *)((long)local_43 + 1),(void *)0x0);
  if (!bVar1) {
    local_7b = kj::_::Debug::shouldLog(ERROR);
    while (local_7b != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x55,ERROR,"\"failed: expected \" \"result != nullptr\"",
                 (char (*) [35])"failed: expected result != nullptr");
      local_7b = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)((long)local_43 + 3));
  if (!bVar1) {
    local_7c = kj::_::Debug::shouldLog(ERROR);
    while (local_7c != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x56,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      local_7c = false;
    }
  }
  Maybe<kj::_::Tuple<>_>::~Maybe((Maybe<kj::_::Tuple<>_> *)((long)local_43 + 1));
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)((long)local_43 + 3));
  return;
}

Assistant:

TEST(CommonParsers, ExactElementParser) {
  StringPtr text = "foo";
  Input input(text.begin(), text.end());

  Maybe<Tuple<>> result = exactly('f')(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_FALSE(input.atEnd());

  result = exactly('o')(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_FALSE(input.atEnd());

  result = exactly('x')(input);
  EXPECT_TRUE(result == nullptr);
  EXPECT_FALSE(input.atEnd());

  auto parser = exactly('o');
  ParserRef<Input, Tuple<>> wrapped = ref<Input>(parser);
  result = wrapped(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_TRUE(input.atEnd());
}